

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

bool __thiscall QMessageBoxPrivate::canBeNativeDialog(QMessageBoxPrivate *this)

{
  undefined8 *puVar1;
  byte bVar2;
  bool bVar3;
  Int IVar4;
  int iVar5;
  QPushButton *this_00;
  char *__s2;
  iterator o;
  QMenu *pQVar6;
  long in_RDI;
  long in_FS_OFFSET;
  QPushButton *pushButton;
  QAbstractButton *customButton;
  QList<QAbstractButton_*> *__range1;
  QDialog *q;
  iterator __end1;
  iterator __begin1;
  Option in_stack_ffffffffffffff6c;
  QFlags<QMessageDialogOptions::Option> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar7;
  QDialogPrivate *in_stack_ffffffffffffff88;
  int local_64;
  byte local_41;
  iterator local_30 [4];
  undefined4 local_10;
  QFlagsStorageHelper<QMessageDialogOptions::Option,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(undefined8 **)(in_RDI + 8);
  if ((*(byte *)(in_RDI + 0x2c8) & 1) == 0) {
    bVar2 = QCoreApplication::testAttribute(AA_DontUseNativeDialogs);
    uVar7 = true;
    if ((bVar2 & 1) == 0) {
      bVar3 = QWidget::testAttribute
                        ((QWidget *)CONCAT17(1,in_stack_ffffffffffffff78),
                         (WidgetAttribute)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      uVar7 = true;
      if (!bVar3) {
        bVar3 = QWidget::testAttribute
                          ((QWidget *)CONCAT17(1,in_stack_ffffffffffffff78),
                           (WidgetAttribute)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        uVar7 = true;
        if (!bVar3) {
          QSharedPointer<QMessageDialogOptions>::operator->
                    ((QSharedPointer<QMessageDialogOptions> *)0x7a8c9b);
          local_10 = QMessageDialogOptions::options();
          local_c.super_QFlagsStorage<QMessageDialogOptions::Option>.i =
               (QFlagsStorage<QMessageDialogOptions::Option>)
               QFlags<QMessageDialogOptions::Option>::operator&
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          IVar4 = ::QFlags::operator_cast_to_int((QFlags *)&local_c);
          uVar7 = IVar4 != 0;
        }
      }
    }
    if ((bool)uVar7 == false) {
      this_00 = (QPushButton *)QMetaObject::className();
      (**(code **)*puVar1)();
      __s2 = (char *)QMetaObject::className();
      iVar5 = strcmp((char *)this_00,__s2);
      if (iVar5 == 0) {
        QDialogButtonBox::buttons((QDialogButtonBox *)CONCAT17(uVar7,in_stack_ffffffffffffff78));
        local_30[0].i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
        local_30[0] = QList<QAbstractButton_*>::begin((QList<QAbstractButton_*> *)this_00);
        o = QList<QAbstractButton_*>::end((QList<QAbstractButton_*> *)this_00);
        while (bVar3 = QList<QAbstractButton_*>::iterator::operator!=(local_30,o), bVar3) {
          QList<QAbstractButton_*>::iterator::operator*(local_30);
          in_stack_ffffffffffffff88 =
               (QDialogPrivate *)qobject_cast<QPushButton*>((QObject *)0x7a8dd5);
          if ((in_stack_ffffffffffffff88 != (QDialogPrivate *)0x0) &&
             (pQVar6 = QPushButton::menu(this_00), pQVar6 != (QMenu *)0x0)) {
            local_41 = 0;
            local_64 = 1;
            goto LAB_007a8e11;
          }
          QList<QAbstractButton_*>::iterator::operator++(local_30);
        }
        local_64 = 2;
LAB_007a8e11:
        QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x7a8e1b);
        if (local_64 != 1) {
          local_41 = QDialogPrivate::canBeNativeDialog(in_stack_ffffffffffffff88);
        }
      }
      else {
        local_41 = 0;
      }
    }
    else {
      local_41 = 0;
    }
  }
  else {
    local_41 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool QMessageBoxPrivate::canBeNativeDialog() const
{
    // Don't use Q_Q here! This function is called from ~QDialog,
    // so Q_Q calling q_func() invokes undefined behavior (invalid cast in q_func()).
    const QDialog * const q = static_cast<const QDialog*>(q_ptr);
    if (nativeDialogInUse)
        return true;
    if (QCoreApplication::testAttribute(Qt::AA_DontUseNativeDialogs)
        || q->testAttribute(Qt::WA_DontShowOnScreen)
        || q->testAttribute(Qt::WA_StyleSheet)
        || (options->options() & QMessageDialogOptions::Option::DontUseNativeDialog)) {
        return false;
    }

    if (strcmp(QMessageBox::staticMetaObject.className(), q->metaObject()->className()) != 0)
        return false;

#if QT_CONFIG(menu)
    for (auto *customButton : buttonBox->buttons()) {
        if (QPushButton *pushButton = qobject_cast<QPushButton *>(customButton)) {
            // We can't support buttons with menus in native dialogs (yet)
            if (pushButton->menu())
                return false;
        }
    }
#endif

    return QDialogPrivate::canBeNativeDialog();
}